

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O3

UINT8 device_start_x1_010(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  DEV_DATA DVar2;
  uint uVar3;
  
  DVar2.chipInf = calloc(1,0x20b0);
  if (DVar2.chipInf == (void *)0x0) {
    return 0xff;
  }
  uVar3 = cfg->clock;
  *(uint *)((long)DVar2.chipInf + 0x209c) = uVar3;
  uVar3 = uVar3 >> 9;
  *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = uVar3;
  if (cfg->srMode == '\x02') {
    uVar1 = cfg->smplRate;
    if (cfg->smplRate <= uVar3) goto LAB_001712bc;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_001712bc;
    uVar1 = cfg->smplRate;
  }
  uVar3 = uVar1;
  *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = uVar3;
LAB_001712bc:
  *(void **)DVar2.chipInf = DVar2.chipInf;
  retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
  retDevInf->sampleRate = uVar3;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_x1_010(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	x1_010_state *info;

	info = (x1_010_state *)calloc(1, sizeof(x1_010_state));
	if (info == NULL)
		return 0xFF;

	info->base_clock    = cfg->clock;
	info->rate          = info->base_clock / 512;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->rate, cfg->smplRate);

	info->ROMSize       = 0x00;
	info->rom           = NULL;

	/* Print some more debug info */
	//LOG_SOUND(("masterclock = %d rate = %d\n", info->base_clock, info->rate ));

	x1_010_set_mute_mask(info, 0x0000);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);

	return 0x00;
}